

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::
format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
::on_text(format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *this,wchar_t *begin,wchar_t *end)

{
  checked_ptr<typename_buffer<wchar_t>::value_type> __dest;
  iterator out;
  back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> local_20;
  
  local_20.container = (this->context).out_.container;
  __dest = internal::reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                     (&local_20,(long)end - (long)begin >> 2);
  if ((long)end - (long)begin != 0) {
    memmove(__dest,begin,(long)end - (long)begin);
  }
  (this->context).out_.container = local_20.container;
  return;
}

Assistant:

void on_text(const Char* begin, const Char* end) {
    auto size = internal::to_unsigned(end - begin);
    auto out = context.out();
    auto&& it = internal::reserve(out, size);
    it = std::copy_n(begin, size, it);
    context.advance_to(out);
  }